

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

ssize_t __thiscall
httplib::ClientImpl::send(ClientImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  id iVar5;
  undefined8 extraout_RAX;
  undefined4 in_register_00000034;
  long lVar6;
  id local_108;
  lock_guard<std::mutex> local_100;
  lock_guard<std::mutex> guard_1;
  function<bool_(httplib::Stream_&)> local_d0;
  byte local_aa;
  byte local_a9;
  bool ret;
  iterator iStack_a8;
  bool close_connection;
  _Self local_a0;
  _Self local_98;
  reference local_90;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *header;
  iterator __end1;
  iterator __begin1;
  Headers *__range1;
  bool local_61;
  SSLClient *pSStack_60;
  bool success;
  SSLClient *scli;
  undefined1 local_4e;
  byte local_4d;
  bool shutdown_gracefully;
  bool is_alive;
  lock_guard<std::mutex> local_40;
  lock_guard<std::mutex> guard;
  lock_guard<std::recursive_mutex> request_mutex_guard;
  Error *error_local;
  Response *res_local;
  Request *req_local;
  ClientImpl *this_local;
  
  lVar6 = CONCAT44(in_register_00000034,__fd);
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)&guard,&this->request_mutex_);
  std::lock_guard<std::mutex>::lock_guard(&local_40,&this->socket_mutex_);
  this->socket_should_be_closed_when_request_is_done_ = false;
  local_4d = 0;
  bVar1 = Socket::is_open(&this->socket_);
  if ((bVar1) && (local_4d = detail::is_socket_alive((this->socket_).sock), !(bool)local_4d)) {
    local_4e = 0;
    (*this->_vptr_ClientImpl[4])(this,&this->socket_,0);
    shutdown_socket(this,&this->socket_);
    close_socket(this,&this->socket_);
  }
  if ((local_4d & 1) == 0) {
    uVar2 = (*this->_vptr_ClientImpl[3])(this,&this->socket_,__n);
    if ((uVar2 & 1) == 0) {
      this_local._7_1_ = 0;
      scli._4_4_ = 1;
      goto LAB_00278915;
    }
    uVar2 = (*this->_vptr_ClientImpl[6])();
    if ((uVar2 & 1) != 0) {
      pSStack_60 = (SSLClient *)this;
      uVar4 = std::__cxx11::string::empty();
      if (((uVar4 & 1) == 0) && (this->proxy_port_ != -1)) {
        local_61 = false;
        bVar1 = SSLClient::connect_with_proxy
                          (pSStack_60,&this->socket_,(Response *)__buf,&local_61,(Error *)__n);
        if (!bVar1) {
          this_local._7_1_ = local_61 & 1;
          scli._4_4_ = 1;
          goto LAB_00278915;
        }
      }
      bVar1 = SSLClient::initialize_ssl(pSStack_60,&this->socket_,(Error *)__n);
      if (!bVar1) {
        this_local._7_1_ = 0;
        scli._4_4_ = 1;
        goto LAB_00278915;
      }
    }
  }
  this->socket_requests_in_flight_ = this->socket_requests_in_flight_ + 1;
  iVar5 = std::this_thread::get_id();
  (this->socket_requests_are_from_thread_)._M_thread = iVar5._M_thread;
  scli._4_4_ = 0;
LAB_00278915:
  std::lock_guard<std::mutex>::~lock_guard(&local_40);
  if (scli._4_4_ == 0) {
    __end1 = std::
             multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::begin(&this->default_headers_);
    header = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)std::
                multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::end(&this->default_headers_);
    while (bVar1 = std::operator!=(&__end1,(_Self *)&header), bVar1) {
      local_90 = std::
                 _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator*(&__end1);
      local_98._M_node =
           (_Base_ptr)
           std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::find((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)(lVar6 + 0x40),&local_90->first);
      local_a0._M_node =
           (_Base_ptr)
           std::
           multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::end((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)(lVar6 + 0x40));
      bVar1 = std::operator==(&local_98,&local_a0);
      if (bVar1) {
        iStack_a8 = std::
                    multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::insert((multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)(lVar6 + 0x40),local_90);
      }
      std::
      _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator++(&__end1);
    }
    local_a9 = ~this->keep_alive_ & 1;
    guard_1._M_device = (mutex_type *)this;
    std::function<bool(httplib::Stream&)>::
    function<httplib::ClientImpl::send(httplib::Request&,httplib::Response&,httplib::Error&)::_lambda(httplib::Stream&)_1_,void>
              ((function<bool(httplib::Stream&)> *)&local_d0,(anon_class_40_5_61c9469f *)&guard_1);
    iVar3 = (*this->_vptr_ClientImpl[5])(this,&this->socket_,&local_d0);
    std::function<bool_(httplib::Stream_&)>::~function(&local_d0);
    local_aa = (byte)iVar3 & 1;
    std::lock_guard<std::mutex>::lock_guard(&local_100,&this->socket_mutex_);
    this->socket_requests_in_flight_ = this->socket_requests_in_flight_ - 1;
    if (this->socket_requests_in_flight_ == 0) {
      std::thread::id::id(&local_108);
      (this->socket_requests_are_from_thread_)._M_thread = local_108._M_thread;
    }
    if ((((this->socket_should_be_closed_when_request_is_done_ & 1U) != 0) || ((local_a9 & 1) != 0))
       || ((local_aa & 1) == 0)) {
      (*this->_vptr_ClientImpl[4])(this,&this->socket_,1);
      shutdown_socket(this,&this->socket_);
      close_socket(this,&this->socket_);
    }
    std::lock_guard<std::mutex>::~lock_guard(&local_100);
    if (((local_aa & 1) == 0) && (*(int *)__n == 0)) {
      *(undefined4 *)__n = 1;
    }
    this_local._7_1_ = local_aa & 1;
    scli._4_4_ = 1;
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)&guard);
  return CONCAT71((int7)((ulong)extraout_RAX >> 8),this_local._7_1_) & 0xffffffffffffff01;
}

Assistant:

inline bool ClientImpl::send(Request& req, Response& res, Error& error) {
        std::lock_guard<std::recursive_mutex> request_mutex_guard(request_mutex_);

        {
            std::lock_guard<std::mutex> guard(socket_mutex_);

            // Set this to false immediately - if it ever gets set to true by the end of
            // the request, we know another thread instructed us to close the socket.
            socket_should_be_closed_when_request_is_done_ = false;

            auto is_alive = false;
            if (socket_.is_open()) {
                is_alive = detail::is_socket_alive(socket_.sock);
                if (!is_alive) {
                    // Attempt to avoid sigpipe by shutting down nongracefully if it seems
                    // like the other side has already closed the connection Also, there
                    // cannot be any requests in flight from other threads since we locked
                    // request_mutex_, so safe to close everything immediately
                    const bool shutdown_gracefully = false;
                    shutdown_ssl(socket_, shutdown_gracefully);
                    shutdown_socket(socket_);
                    close_socket(socket_);
                }
            }

            if (!is_alive) {
                if (!create_and_connect_socket(socket_, error)) { return false; }

            #ifdef CPPHTTPLIB_OPENSSL_SUPPORT
                // TODO: refactoring
                if (is_ssl()) {
                    auto& scli = static_cast<SSLClient&>(*this);
                    if (!proxy_host_.empty() && proxy_port_ != -1) {
                        bool success = false;
                        if (!scli.connect_with_proxy(socket_, res, success, error)) {
                            return success;
                        }
                    }

                    if (!scli.initialize_ssl(socket_, error)) { return false; }
                }
            #endif
            }

            // Mark the current socket as being in use so that it cannot be closed by
            // anyone else while this request is ongoing, even though we will be
            // releasing the mutex.
            if (socket_requests_in_flight_ > 1) {
                assert(socket_requests_are_from_thread_ == std::this_thread::get_id());
            }
            socket_requests_in_flight_ += 1;
            socket_requests_are_from_thread_ = std::this_thread::get_id();
        }

        for (const auto& header : default_headers_) {
            if (req.headers.find(header.first) == req.headers.end()) {
                req.headers.insert(header);
            }
        }

        auto close_connection = !keep_alive_;
        auto ret = process_socket(socket_, [&](Stream& strm) {
            return handle_request(strm, req, res, close_connection, error);
        });

        // Briefly lock mutex in order to mark that a request is no longer ongoing
        {
            std::lock_guard<std::mutex> guard(socket_mutex_);
            socket_requests_in_flight_ -= 1;
            if (socket_requests_in_flight_ <= 0) {
                assert(socket_requests_in_flight_ == 0);
                socket_requests_are_from_thread_ = std::thread::id();
            }

            if (socket_should_be_closed_when_request_is_done_ || close_connection ||
                !ret) {
                shutdown_ssl(socket_, true);
                shutdown_socket(socket_);
                close_socket(socket_);
            }
        }

        if (!ret) {
            if (error == Error::Success) { error = Error::Unknown; }
        }

        return ret;
    }